

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<double,double,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,double *v,double v_min,double v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  ulong uVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  ImVec2 IVar14;
  double dVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pIVar3 = GImGui;
  uVar7 = (ulong)(flags & 1);
  uVar5 = data_type & 0xfffffffe;
  bVar8 = uVar5 == 8;
  bVar6 = power != 1.0;
  fVar19 = (&(bb->Min).x)[uVar7];
  fVar1 = (&(bb->Max).x)[uVar7];
  fVar18 = (fVar1 - fVar19) + -4.0;
  fVar17 = (GImGui->Style).GrabMinSize;
  dVar16 = v_max - v_min;
  dVar15 = (double)(~-(ulong)(v_min < v_max) & (ulong)(v_min - v_max) |
                   -(ulong)(v_min < v_max) & (ulong)dVar16);
  if ((uVar5 != 8) && (0.0 <= dVar15)) {
    fVar11 = (float)((double)fVar18 / (dVar15 + 1.0));
    uVar9 = -(uint)(fVar17 <= fVar11);
    fVar17 = (float)(~uVar9 & (uint)fVar17 | (uint)fVar11 & uVar9);
  }
  if (fVar18 <= fVar17) {
    fVar17 = fVar18;
  }
  if ((!bVar6 || !bVar8) || 0.0 <= v_min * v_max) {
    if (v_min < 0.0) {
      fVar11 = 1.0;
    }
    else {
      fVar11 = 0.0;
    }
  }
  else {
    uVar10 = -(ulong)(-v_min <= v_min);
    dVar12 = pow((double)(uVar10 & (ulong)v_min | ~uVar10 & (ulong)-v_min),1.0 / (double)power);
    uVar10 = -(ulong)(-v_max <= v_max);
    dVar13 = pow((double)(uVar10 & (ulong)v_max | ~uVar10 & (ulong)-v_max),1.0 / (double)power);
    fVar11 = (float)(dVar12 / (dVar13 + dVar12));
  }
  fVar19 = fVar19 + 2.0 + fVar17 * 0.5;
  if (pIVar3->ActiveId != id) {
    bVar6 = false;
    goto LAB_0019203e;
  }
  if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
    IVar14 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    fVar21 = IVar14.x;
    if (uVar7 != 0) {
      fVar21 = -IVar14.y;
    }
    if ((pIVar3->NavActivatePressedId == id) && (pIVar3->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if ((fVar21 != 0.0) || (NAN(fVar21))) {
      fVar20 = SliderCalcRatioFromValueT<double,double>(data_type,*v,v_min,v_max,power,fVar11);
      if ((uVar5 != 8) ||
         (iVar4 = ImParseFormatPrecision(format,3), (bool)(~(bVar6 && bVar8) & iVar4 < 1))) {
        if ((ABS(dVar15) <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          fVar21 = *(float *)(&DAT_0019ad58 + (ulong)(fVar21 < 0.0) * 4) / (float)dVar15;
        }
        else {
          fVar21 = fVar21 / 100.0;
        }
      }
      else {
        fVar21 = fVar21 / 100.0;
        if (0.0 < (GImGui->IO).NavInputs[0xe]) {
          fVar21 = fVar21 / 10.0;
        }
      }
      uVar9 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
      fVar21 = (float)(~uVar9 & (uint)fVar21 | (uint)(fVar21 * 10.0) & uVar9);
      if ((fVar20 < 1.0) || (fVar21 <= 0.0)) {
        if ((fVar20 <= 0.0) && (fVar21 < 0.0)) goto LAB_00191d5c;
        fVar20 = fVar20 + fVar21;
        fVar21 = 1.0;
        if (fVar20 <= 1.0) {
          fVar21 = fVar20;
        }
        fVar20 = (float)(~-(uint)(fVar20 < 0.0) & (uint)fVar21);
        goto LAB_00191ebd;
      }
      bVar2 = false;
      goto LAB_00191ebf;
    }
    bVar2 = false;
    fVar20 = 0.0;
  }
  else {
    fVar20 = 0.0;
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar3->IO).MouseDown[0] == false) {
        ClearActiveID();
        fVar20 = 0.0;
LAB_00191d5c:
        bVar2 = false;
      }
      else {
        if (0.0 < fVar18 - fVar17) {
          fVar21 = (*(float *)((pIVar3->IO).MouseDown + uVar7 * 4 + -8) - fVar19) /
                   (fVar18 - fVar17);
          fVar20 = 1.0;
          if (fVar21 <= 1.0) {
            fVar20 = fVar21;
          }
          fVar20 = (float)(~-(uint)(fVar21 < 0.0) & (uint)fVar20);
        }
        if (uVar7 != 0) {
          fVar20 = 1.0 - fVar20;
        }
LAB_00191ebd:
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
  }
LAB_00191ebf:
  if (bVar2) {
    if (bVar6 && bVar8) {
      if (fVar11 <= fVar20) {
        uVar5 = -(uint)(1e-06 < ABS(fVar11 + -1.0));
        fVar21 = powf((float)(~uVar5 & (uint)fVar20 |
                             (uint)((fVar20 - fVar11) / (1.0 - fVar11)) & uVar5),power);
        dVar15 = (double)(-(ulong)(0.0 <= v_min) & (ulong)v_min);
        dVar15 = (double)fVar21 * (v_max - dVar15) + dVar15;
      }
      else {
        fVar21 = powf(1.0 - fVar20 / fVar11,power);
        dVar15 = v_max;
        if (0.0 <= v_max) {
          dVar15 = 0.0;
        }
        dVar15 = (double)fVar21 * (v_min - dVar15) + dVar15;
      }
    }
    else {
      if (uVar5 == 8) {
        dVar15 = dVar16 * (double)fVar20;
      }
      else {
        dVar16 = dVar16 * (double)fVar20;
        dVar15 = dVar16 + 0.5;
        if (dVar16 + 0.5 <= dVar16) {
          dVar15 = dVar16;
        }
      }
      dVar15 = dVar15 + v_min;
    }
    dVar15 = RoundScalarWithFormatT<double,double>(format,data_type,dVar15);
    dVar16 = *v;
    if ((dVar16 != dVar15) || (NAN(dVar16) || NAN(dVar15))) {
      *v = dVar15;
      bVar6 = true;
    }
    else {
      bVar6 = (bool)(-(dVar15 != dVar16) & 1);
    }
  }
  else {
    bVar6 = false;
  }
LAB_0019203e:
  if (1.0 <= fVar18) {
    fVar18 = SliderCalcRatioFromValueT<double,double>(data_type,*v,v_min,v_max,power,fVar11);
    if (uVar7 != 0) {
      fVar18 = 1.0 - fVar18;
    }
    fVar19 = (((fVar1 + -2.0) - fVar17 * 0.5) - fVar19) * fVar18 + fVar19;
    if (uVar7 == 0) {
      fVar1 = (bb->Min).y;
      fVar18 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar17 * 0.5 + fVar19;
      (out_grab_bb->Min).y = fVar1 + 2.0;
      (out_grab_bb->Max).x = fVar17 * 0.5 + fVar19;
      (out_grab_bb->Max).y = fVar18 + -2.0;
    }
    else {
      fVar1 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar17 * 0.5 + fVar19;
      (out_grab_bb->Max).x = fVar1 + -2.0;
      (out_grab_bb->Max).y = fVar17 * 0.5 + fVar19;
    }
  }
  else {
    IVar14 = bb->Min;
    out_grab_bb->Min = IVar14;
    out_grab_bb->Max = IVar14;
  }
  return bVar6;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}